

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memjrnlRead(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  sqlite3_io_methods *psVar5;
  int iVar6;
  
  if ((iOfst == 0) || (pJfd[4].pMethods != (sqlite3_io_methods *)iOfst)) {
    psVar5 = (sqlite3_io_methods *)(pJfd + 1);
    lVar3 = 0x3f8;
    do {
      psVar5 = *(sqlite3_io_methods **)psVar5;
      if (psVar5 == (sqlite3_io_methods *)0x0) break;
      bVar1 = lVar3 <= iOfst;
      lVar3 = lVar3 + 0x3f8;
    } while (bVar1);
  }
  else {
    psVar5 = pJfd[5].pMethods;
  }
  lVar3 = iOfst % 0x3f8;
  iVar4 = iAmt;
  do {
    iVar6 = 0x3f8 - (int)lVar3;
    iVar2 = iVar6;
    if (iVar4 < iVar6) {
      iVar2 = iVar4;
    }
    memcpy(zBuf,(void *)((long)&psVar5->xClose + (long)(int)lVar3),(long)iVar2);
    iVar4 = iVar4 - iVar6;
    if ((iVar4 < 0) || (psVar5 = *(sqlite3_io_methods **)psVar5, iVar4 == 0)) break;
    zBuf = (void *)((long)zBuf + (long)iVar2);
    lVar3 = 0;
  } while (psVar5 != (sqlite3_io_methods *)0x0);
  pJfd[4].pMethods = (sqlite3_io_methods *)(iAmt + iOfst);
  pJfd[5].pMethods = psVar5;
  return 0;
}

Assistant:

static int memjrnlRead(
  sqlite3_file *pJfd,    /* The journal file from which to read */
  void *zBuf,            /* Put the results here */
  int iAmt,              /* Number of bytes to read */
  sqlite_int64 iOfst     /* Begin reading at this offset */
){
  MemJournal *p = (MemJournal *)pJfd;
  u8 *zOut = zBuf;
  int nRead = iAmt;
  int iChunkOffset;
  FileChunk *pChunk;

  /* SQLite never tries to read past the end of a rollback journal file */
  assert( iOfst+iAmt<=p->endpoint.iOffset );

  if( p->readpoint.iOffset!=iOfst || iOfst==0 ){
    sqlite3_int64 iOff = 0;
    for(pChunk=p->pFirst; 
        ALWAYS(pChunk) && (iOff+JOURNAL_CHUNKSIZE)<=iOfst;
        pChunk=pChunk->pNext
    ){
      iOff += JOURNAL_CHUNKSIZE;
    }
  }else{
    pChunk = p->readpoint.pChunk;
  }

  iChunkOffset = (int)(iOfst%JOURNAL_CHUNKSIZE);
  do {
    int iSpace = JOURNAL_CHUNKSIZE - iChunkOffset;
    int nCopy = MIN(nRead, (JOURNAL_CHUNKSIZE - iChunkOffset));
    memcpy(zOut, &pChunk->zChunk[iChunkOffset], nCopy);
    zOut += nCopy;
    nRead -= iSpace;
    iChunkOffset = 0;
  } while( nRead>=0 && (pChunk=pChunk->pNext)!=0 && nRead>0 );
  p->readpoint.iOffset = iOfst+iAmt;
  p->readpoint.pChunk = pChunk;

  return SQLITE_OK;
}